

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadGlobalSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  bool local_41;
  Type TStack_40;
  bool mutable_;
  Type global_type;
  Index global_index;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_globals;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_globals = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x24])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    RVar2 = ReadCount(this,&local_28,"global count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x25])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        for (global_type.type_index_ = 0; global_type.type_index_ < local_28;
            global_type.type_index_ = global_type.type_index_ + 1) {
          global_type.enum_ = this->num_global_imports_ + global_type.type_index_;
          RVar2 = ReadGlobalHeader(this,&stack0xffffffffffffffc0,&local_41);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x26])
                                  (this->delegate_,(ulong)(uint)global_type.enum_,TStack_40,
                                   (ulong)(local_41 & 1));
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"BeginGlobal callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x27])
                                  (this->delegate_,(ulong)(uint)global_type.enum_);
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"BeginGlobalInitExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadInitExpr(this,global_type.enum_);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x28])
                                  (this->delegate_,(ulong)(uint)global_type.enum_);
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"EndGlobalInitExpr callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x29])();
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"EndGlobal callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2a])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndGlobalSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnGlobalCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginGlobalSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadGlobalSection(Offset section_size) {
  CALLBACK(BeginGlobalSection, section_size);
  Index num_globals;
  CHECK_RESULT(ReadCount(&num_globals, "global count"));
  CALLBACK(OnGlobalCount, num_globals);
  for (Index i = 0; i < num_globals; ++i) {
    Index global_index = num_global_imports_ + i;
    Type global_type;
    bool mutable_;
    CHECK_RESULT(ReadGlobalHeader(&global_type, &mutable_));
    CALLBACK(BeginGlobal, global_index, global_type, mutable_);
    CALLBACK(BeginGlobalInitExpr, global_index);
    CHECK_RESULT(ReadInitExpr(global_index));
    CALLBACK(EndGlobalInitExpr, global_index);
    CALLBACK(EndGlobal, global_index);
  }
  CALLBACK0(EndGlobalSection);
  return Result::Ok;
}